

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int mbedtls_ccm_star_encrypt_and_tag
              (mbedtls_ccm_context *ctx,size_t length,uchar *iv,size_t iv_len,uchar *add,
              size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  int iVar1;
  size_t add_len_local;
  uchar *add_local;
  size_t iv_len_local;
  uchar *iv_local;
  size_t length_local;
  mbedtls_ccm_context *ctx_local;
  
  iVar1 = ccm_auth_crypt(ctx,0,length,iv,iv_len,add,add_len,input,output,tag,tag_len);
  return iVar1;
}

Assistant:

int mbedtls_ccm_star_encrypt_and_tag( mbedtls_ccm_context *ctx, size_t length,
                         const unsigned char *iv, size_t iv_len,
                         const unsigned char *add, size_t add_len,
                         const unsigned char *input, unsigned char *output,
                         unsigned char *tag, size_t tag_len )
{
    CCM_VALIDATE_RET( ctx != NULL );
    CCM_VALIDATE_RET( iv != NULL );
    CCM_VALIDATE_RET( add_len == 0 || add != NULL );
    CCM_VALIDATE_RET( length == 0 || input != NULL );
    CCM_VALIDATE_RET( length == 0 || output != NULL );
    CCM_VALIDATE_RET( tag_len == 0 || tag != NULL );
    return( ccm_auth_crypt( ctx, CCM_ENCRYPT, length, iv, iv_len,
                            add, add_len, input, output, tag, tag_len ) );
}